

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O1

void mdct_backward(mdct_lookup *init,float *in,float *out)

{
  float *x;
  float *pfVar1;
  int iVar2;
  int *piVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  int points;
  long lVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  points = init->n >> 1;
  pfVar6 = in + (long)points + -7;
  x = out + points;
  lVar7 = (long)(init->n >> 2);
  pfVar13 = x + lVar7;
  pfVar5 = init->trig;
  pfVar4 = out + (long)points + lVar7 + -1;
  pfVar8 = pfVar5 + lVar7 + 3;
  do {
    pfVar4[-3] = -pfVar6[2] * *pfVar8 - pfVar8[-1] * *pfVar6;
    pfVar4[-2] = *pfVar6 * *pfVar8 - pfVar8[-1] * pfVar6[2];
    pfVar4[-1] = -pfVar6[6] * pfVar8[-2] - pfVar8[-3] * pfVar6[4];
    *pfVar4 = pfVar6[4] * pfVar8[-2] - pfVar8[-3] * pfVar6[6];
    pfVar6 = pfVar6 + -8;
    pfVar4 = pfVar4 + -4;
    pfVar8 = pfVar8 + 4;
  } while (in <= pfVar6);
  pfVar4 = in + (long)points + -8;
  pfVar5 = pfVar5 + lVar7 + -1;
  pfVar6 = pfVar13;
  do {
    *pfVar6 = pfVar4[4] * *pfVar5 + pfVar4[6] * pfVar5[-1];
    pfVar6[1] = pfVar4[4] * pfVar5[-1] - *pfVar5 * pfVar4[6];
    pfVar6[2] = *pfVar4 * pfVar5[-2] + pfVar4[2] * pfVar5[-3];
    pfVar6[3] = *pfVar4 * pfVar5[-3] - pfVar5[-2] * pfVar4[2];
    pfVar4 = pfVar4 + -8;
    pfVar6 = pfVar6 + 4;
    pfVar5 = pfVar5 + -4;
  } while (in <= pfVar4);
  mdct_butterflies(init,x,points);
  iVar2 = init->n;
  pfVar4 = init->trig;
  piVar3 = init->bitrev;
  pfVar6 = out + (iVar2 >> 1);
  lVar9 = 0;
  pfVar5 = pfVar6;
  do {
    lVar11 = (long)*(int *)((long)piVar3 + lVar9 + 4);
    fVar17 = pfVar6[(long)*(int *)((long)piVar3 + lVar9) + 1] - pfVar6[lVar11 + 1];
    fVar15 = pfVar6[*(int *)((long)piVar3 + lVar9)] + pfVar6[lVar11];
    fVar14 = *(float *)((long)pfVar4 + lVar9 + (long)iVar2 * 4);
    fVar16 = *(float *)((long)pfVar4 + lVar9 + (long)iVar2 * 4 + 4);
    fVar18 = fVar15 * fVar14 + fVar17 * fVar16;
    fVar16 = fVar15 * fVar16 - fVar17 * fVar14;
    fVar15 = (pfVar6[(long)*(int *)((long)piVar3 + lVar9) + 1] + pfVar6[lVar11 + 1]) * 0.5;
    fVar14 = (pfVar6[*(int *)((long)piVar3 + lVar9)] - pfVar6[lVar11]) * 0.5;
    pfVar8 = (float *)((long)out + lVar9 + 0x10);
    pfVar8[-4] = fVar15 + fVar18;
    pfVar5[-2] = fVar15 - fVar18;
    pfVar8[-3] = fVar14 + fVar16;
    pfVar5[-1] = fVar16 - fVar14;
    lVar11 = (long)*(int *)((long)piVar3 + lVar9 + 8);
    lVar12 = (long)*(int *)((long)piVar3 + lVar9 + 0xc);
    fVar17 = pfVar6[lVar11 + 1] - pfVar6[lVar12 + 1];
    fVar15 = pfVar6[lVar11] + pfVar6[lVar12];
    fVar14 = *(float *)((long)pfVar4 + lVar9 + (long)iVar2 * 4 + 8);
    fVar16 = *(float *)((long)pfVar4 + lVar9 + (long)iVar2 * 4 + 0xc);
    fVar18 = fVar15 * fVar14 + fVar17 * fVar16;
    fVar16 = fVar15 * fVar16 - fVar17 * fVar14;
    fVar15 = (pfVar6[lVar11 + 1] + pfVar6[lVar12 + 1]) * 0.5;
    fVar14 = (pfVar6[lVar11] - pfVar6[lVar12]) * 0.5;
    pfVar8[-2] = fVar15 + fVar18;
    pfVar5[-4] = fVar15 - fVar18;
    pfVar8[-1] = fVar14 + fVar16;
    pfVar5[-3] = fVar16 - fVar14;
    pfVar5 = pfVar5 + -4;
    lVar9 = lVar9 + 0x10;
  } while (pfVar8 < pfVar5);
  pfVar4 = pfVar4 + 7;
  pfVar5 = out + lVar7;
  pfVar6 = pfVar5;
  pfVar8 = pfVar13;
  pfVar10 = out;
  do {
    pfVar1 = pfVar6 + (long)points + -4;
    pfVar1[3] = *pfVar10 * pfVar4[(long)points + -6] - pfVar4[(long)points + -7] * pfVar10[1];
    pfVar5[points] =
         -(*pfVar10 * pfVar4[(long)points + -7] + pfVar10[1] * pfVar4[(long)points + -6]);
    pfVar1[2] = pfVar10[2] * pfVar4[(long)points + -4] - pfVar4[(long)points + -5] * pfVar10[3];
    pfVar8[1] = -(pfVar10[2] * pfVar4[(long)points + -5] + pfVar10[3] * pfVar4[(long)points + -4]);
    pfVar1[1] = pfVar10[4] * pfVar4[(long)points + -2] - pfVar4[(long)points + -3] * pfVar10[5];
    pfVar8[2] = -(pfVar10[4] * pfVar4[(long)points + -3] + pfVar10[5] * pfVar4[(long)points + -2]);
    *pfVar1 = pfVar10[6] * pfVar4[points] - pfVar4[(long)points + -1] * pfVar10[7];
    pfVar8[3] = -(pfVar10[6] * pfVar4[(long)points + -1] + pfVar10[7] * pfVar4[points]);
    pfVar8 = pfVar8 + 4;
    pfVar10 = pfVar10 + 8;
    pfVar4 = pfVar4 + 8;
    pfVar6 = pfVar6 + -4;
    pfVar5 = pfVar5 + 4;
  } while (pfVar10 < pfVar1);
  pfVar5 = out + lVar7;
  pfVar6 = out + lVar7;
  do {
    pfVar4 = pfVar6 + -4;
    fVar14 = pfVar6[(long)points + -1];
    pfVar6[-1] = fVar14;
    *pfVar5 = -fVar14;
    fVar14 = pfVar6[(long)points + -2];
    pfVar6[-2] = fVar14;
    pfVar5[1] = -fVar14;
    fVar14 = pfVar6[(long)points + -3];
    pfVar6[-3] = fVar14;
    pfVar5[2] = -fVar14;
    fVar14 = pfVar4[points];
    *pfVar4 = fVar14;
    pfVar5[3] = -fVar14;
    pfVar5 = pfVar5 + 4;
    pfVar6 = pfVar4;
  } while (pfVar5 < pfVar4 + points);
  pfVar5 = out + (long)points + lVar7 + 3;
  do {
    pfVar13[-4] = *pfVar5;
    pfVar13[-3] = pfVar5[-1];
    pfVar13[-2] = pfVar5[-2];
    pfVar13[-1] = pfVar5[-3];
    pfVar13 = pfVar13 + -4;
    pfVar5 = pfVar5 + 4;
  } while (x < pfVar13);
  return;
}

Assistant:

void mdct_backward(mdct_lookup *init, DATA_TYPE *in, DATA_TYPE *out){
  int n=init->n;
  int n2=n>>1;
  int n4=n>>2;

  /* rotate */

  DATA_TYPE *iX = in+n2-7;
  DATA_TYPE *oX = out+n2+n4;
  DATA_TYPE *T  = init->trig+n4;

  do{
    oX         -= 4;
    oX[0]       = MULT_NORM(-iX[2] * T[3] - iX[0]  * T[2]);
    oX[1]       = MULT_NORM (iX[0] * T[3] - iX[2]  * T[2]);
    oX[2]       = MULT_NORM(-iX[6] * T[1] - iX[4]  * T[0]);
    oX[3]       = MULT_NORM (iX[4] * T[1] - iX[6]  * T[0]);
    iX         -= 8;
    T          += 4;
  }while(iX>=in);

  iX            = in+n2-8;
  oX            = out+n2+n4;
  T             = init->trig+n4;

  do{
    T          -= 4;
    oX[0]       =  MULT_NORM (iX[4] * T[3] + iX[6] * T[2]);
    oX[1]       =  MULT_NORM (iX[4] * T[2] - iX[6] * T[3]);
    oX[2]       =  MULT_NORM (iX[0] * T[1] + iX[2] * T[0]);
    oX[3]       =  MULT_NORM (iX[0] * T[0] - iX[2] * T[1]);
    iX         -= 8;
    oX         += 4;
  }while(iX>=in);

  mdct_butterflies(init,out+n2,n2);
  mdct_bitreverse(init,out);

  /* roatate + window */

  {
    DATA_TYPE *oX1=out+n2+n4;
    DATA_TYPE *oX2=out+n2+n4;
    DATA_TYPE *iX =out;
    T             =init->trig+n2;

    do{
      oX1-=4;

      oX1[3]  =  MULT_NORM (iX[0] * T[1] - iX[1] * T[0]);
      oX2[0]  = -MULT_NORM (iX[0] * T[0] + iX[1] * T[1]);

      oX1[2]  =  MULT_NORM (iX[2] * T[3] - iX[3] * T[2]);
      oX2[1]  = -MULT_NORM (iX[2] * T[2] + iX[3] * T[3]);

      oX1[1]  =  MULT_NORM (iX[4] * T[5] - iX[5] * T[4]);
      oX2[2]  = -MULT_NORM (iX[4] * T[4] + iX[5] * T[5]);

      oX1[0]  =  MULT_NORM (iX[6] * T[7] - iX[7] * T[6]);
      oX2[3]  = -MULT_NORM (iX[6] * T[6] + iX[7] * T[7]);

      oX2+=4;
      iX    +=   8;
      T     +=   8;
    }while(iX<oX1);

    iX=out+n2+n4;
    oX1=out+n4;
    oX2=oX1;

    do{
      oX1-=4;
      iX-=4;

      oX2[0] = -(oX1[3] = iX[3]);
      oX2[1] = -(oX1[2] = iX[2]);
      oX2[2] = -(oX1[1] = iX[1]);
      oX2[3] = -(oX1[0] = iX[0]);

      oX2+=4;
    }while(oX2<iX);

    iX=out+n2+n4;
    oX1=out+n2+n4;
    oX2=out+n2;
    do{
      oX1-=4;
      oX1[0]= iX[3];
      oX1[1]= iX[2];
      oX1[2]= iX[1];
      oX1[3]= iX[0];
      iX+=4;
    }while(oX1>oX2);
  }
}